

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
::destroy_slots(raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                *this)

{
  BitMask<unsigned_short,_16,_0,_false> *pBVar1;
  bool bVar2;
  CommonFields *this_00;
  size_t capacity;
  NonIterableBitMask<unsigned_long,_8,_3> NVar3;
  BitMask<unsigned_short,_16,_0,_false> *pBVar4;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *this_local;
  uint32_t i_1;
  BitMask<unsigned_short,_16,_0,_false> __end4_1;
  BitMask<unsigned_short,_16,_0,_false> __begin4_1;
  NonIterableBitMask<unsigned_short,_16,_0> local_aa;
  NonIterableBitMask<unsigned_short,_16,_0> *local_a8;
  BitMask<unsigned_short,_16,_0,_false> *__range4_1;
  size_t original_size_for_assert;
  size_t remaining;
  NonIterableBitMask<unsigned_long,_8,_3> NStack_88;
  uint32_t i;
  BitMask<unsigned_long,_8,_3,_false> __end4;
  BitMask<unsigned_long,_8,_3,_false> __begin4;
  BitMask<unsigned_long,_8,_3,_false> *__range4;
  NonIterableBitMask<unsigned_long,_8,_3> local_68;
  BitMask<unsigned_long,_8,_3,_false> mask;
  ctrl_t *ctrl;
  size_t cap;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *local_40;
  slot_type *local_38;
  long local_30;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  **local_28;
  slot_type *local_20;
  long local_18;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  **local_10;
  
  bVar2 = is_soo(this);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_soo()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xdcc,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>>::destroy_slots() [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, unsigned long>>>]"
                 );
  }
  this_00 = common(this);
  cap = (size_t)slot_array(this);
  local_40 = this;
  capacity = CommonFields::capacity(this_00);
  mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ =
       (NonIterableBitMask<unsigned_long,_8,_3>)CommonFields::control(this_00);
  bVar2 = is_small(capacity);
  if (bVar2) {
    if (8 < capacity) {
      __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x753,
                    "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h:3536:9)]"
                   );
    }
    GroupPortableImpl::GroupPortableImpl
              ((GroupPortableImpl *)&__range4,
               (ctrl_t *)((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ + capacity)
              );
    local_68.mask_ = (unsigned_long)GroupPortableImpl::MaskFull((GroupPortableImpl *)&__range4);
    mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ =
         (NonIterableBitMask<unsigned_long,_8,_3>)
         ((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ - 1);
    __end4 = BitMask<unsigned_long,_8,_3,_false>::begin
                       ((BitMask<unsigned_long,_8,_3,_false> *)&local_68);
    NStack_88.mask_ =
         (unsigned_long)
         BitMask<unsigned_long,_8,_3,_false>::end((BitMask<unsigned_long,_8,_3,_false> *)&local_68);
    while (bVar2 = container_internal::operator!=
                             (&__end4,(BitMask<unsigned_long,_8,_3,_false> *)
                                      &stack0xffffffffffffff78), bVar2) {
      remaining._4_4_ = BitMask<unsigned_long,_8,_3,_false>::operator*(&__end4);
      local_30 = (long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ +
                 (ulong)remaining._4_4_;
      local_38 = (slot_type *)(cap + ((ulong)remaining._4_4_ - 1) * 0x30);
      local_28 = &local_40;
      destroy(local_40,local_38);
      BitMask<unsigned_long,_8,_3,_false>::operator++(&__end4);
    }
  }
  else {
    __range4_1 = (BitMask<unsigned_short,_16,_0,_false> *)CommonFields::size(this_00);
    original_size_for_assert = (size_t)__range4_1;
    while (pBVar1 = __range4_1, original_size_for_assert != 0) {
      GroupSse2Impl::GroupSse2Impl
                ((GroupSse2Impl *)&i_1,
                 (ctrl_t *)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_);
      local_aa.mask_ = (unsigned_short)GroupSse2Impl::MaskFull((GroupSse2Impl *)&i_1);
      local_a8 = &local_aa;
      this_local._6_2_ =
           (unsigned_short)
           BitMask<unsigned_short,_16,_0,_false>::begin
                     ((BitMask<unsigned_short,_16,_0,_false> *)local_a8);
      this_local._4_2_ =
           (unsigned_short)
           BitMask<unsigned_short,_16,_0,_false>::end
                     ((BitMask<unsigned_short,_16,_0,_false> *)local_a8);
      while (bVar2 = container_internal::operator!=
                               ((BitMask<unsigned_short,_16,_0,_false> *)((long)&this_local + 6),
                                (BitMask<unsigned_short,_16,_0,_false> *)((long)&this_local + 4)),
            bVar2) {
        this_local._0_4_ =
             BitMask<unsigned_short,_16,_0,_false>::operator*
                       ((BitMask<unsigned_short,_16,_0,_false> *)((long)&this_local + 6));
        bVar2 = IsFull(*(ctrl_t *)
                        ((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ +
                        (ulong)(uint32_t)this_local));
        if (!bVar2) {
          __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x764,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h:3536:9)]"
                       );
        }
        local_18 = (long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ +
                   (ulong)(uint32_t)this_local;
        local_20 = (slot_type *)(cap + (ulong)(uint32_t)this_local * 0x30);
        local_10 = &local_40;
        destroy(local_40,local_20);
        original_size_for_assert = original_size_for_assert - 1;
        BitMask<unsigned_short,_16,_0,_false>::operator++
                  ((BitMask<unsigned_short,_16,_0,_false> *)((long)&this_local + 6));
      }
      NVar3 = mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ + 0x10;
      cap = cap + 0x300;
      if ((original_size_for_assert == 0) ||
         (bVar2 = false,
         *(char *)((long)mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ + 0xf) != -1)) {
        bVar2 = true;
      }
      mask.super_NonIterableBitMask<unsigned_long,_8,_3>.mask_ =
           (NonIterableBitMask<unsigned_long,_8,_3>)
           (NonIterableBitMask<unsigned_long,_8,_3>)NVar3.mask_;
      if (!bVar2) {
        __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x76b,
                      "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h:3536:9)]"
                     );
      }
    }
    pBVar4 = (BitMask<unsigned_short,_16,_0,_false> *)CommonFields::size(this_00);
    if (pBVar1 < pBVar4) {
      __assert_fail("original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x770,
                    "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<std::basic_string<char>, std::pair<unsigned long, unsigned long>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h:3536:9)]"
                   );
    }
  }
  return;
}

Assistant:

inline void destroy_slots() {
    assert(!is_soo());
    if (PolicyTraits::template destroy_is_trivial<Alloc>()) return;
    IterateOverFullSlots(
        common(), slot_array(),
        [&](const ctrl_t*, slot_type* slot)
            ABSL_ATTRIBUTE_ALWAYS_INLINE { this->destroy(slot); });
  }